

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naivelog.cpp
# Opt level: O3

int __thiscall naivelog::write_log(naivelog *this,char *oristr,int length)

{
  size_t sVar1;
  ssize_t sVar2;
  naivelog *this_00;
  naivelog local_438;
  char str [1024];
  
  if (this->enabled != false) {
    this_00 = &local_438;
    memset(&local_438,0,0x400);
    get_currenttime(this_00,&local_438.enabled);
    sVar1 = strlen(&local_438.enabled);
    strcat(&local_438.enabled,oristr);
    sVar2 = write(this->logfd,&local_438,(long)((int)sVar1 + length));
    return (int)sVar2;
  }
  return -1;
}

Assistant:

int naivelog::write_log(char *oristr, int length)
{
    if (enabled == false)
        return -1;
    char str[1024];
    memset(str, 0, sizeof(str));
    get_currenttime(str);

    length += strlen(str);
    strcat(str, oristr);

    int ret = 0;

    //日志文件极大地影响了性能。
    //TODO: 改成mmap

#ifdef USE_O_APPEND
    ret = write(logfd, str, length);
    // fsync(fd);
#else
    struct flock lock;
    lock.l_type = F_WRLCK;
    lock.l_whence = SEEK_SET;
    lock.l_start = 0;
    lock.l_len = 0;
    //lock.l_pid = getpid();
    do
    {
        ret = fcntl(logfd, F_SETFL, &lock);
    } while (ret < 0);

    ret = write(logfd, str, length);

    fsync(logfd);
    fcntl(logfd, F_UNLCK, 0);
#endif
    return ret;
}